

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cpp
# Opt level: O1

CSHA512 * __thiscall CSHA512::Write(CSHA512 *this,uchar *data,size_t len)

{
  uchar *puVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = data + len;
  uVar3 = this->bytes & 0x7f;
  if (uVar3 != 0) {
    if (len + uVar3 < 0x80) goto LAB_00439a14;
    sVar4 = 0x80 - uVar3;
    memcpy(this->buf + uVar3,data,sVar4);
    this->bytes = this->bytes + sVar4;
    data = data + sVar4;
    anon_unknown.dwarf_190893b::sha512::Transform(this->s,this->buf);
  }
  uVar3 = 0;
LAB_00439a14:
  for (sVar4 = (long)puVar1 - (long)data; 0x7f < (long)sVar4; sVar4 = sVar4 - 0x80) {
    anon_unknown.dwarf_190893b::sha512::Transform(this->s,data);
    this->bytes = this->bytes + 0x80;
    data = data + 0x80;
  }
  if (data < puVar1) {
    memcpy(this->buf + uVar3,data,sVar4);
    this->bytes = this->bytes + sVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

CSHA512& CSHA512::Write(const unsigned char* data, size_t len)
{
    const unsigned char* end = data + len;
    size_t bufsize = bytes % 128;
    if (bufsize && bufsize + len >= 128) {
        // Fill the buffer, and process it.
        memcpy(buf + bufsize, data, 128 - bufsize);
        bytes += 128 - bufsize;
        data += 128 - bufsize;
        sha512::Transform(s, buf);
        bufsize = 0;
    }
    while (end - data >= 128) {
        // Process full chunks directly from the source.
        sha512::Transform(s, data);
        data += 128;
        bytes += 128;
    }
    if (end > data) {
        // Fill the buffer with what remains.
        memcpy(buf + bufsize, data, end - data);
        bytes += end - data;
    }
    return *this;
}